

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw_bwt.h
# Opt level: O0

void __thiscall bwtil::cw_bwt::computeActualEntropy(cw_bwt *this)

{
  reference pvVar1;
  reference this_00;
  ulong *in_RDI;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar5 [16];
  undefined1 in_ZMM2 [64];
  double H0;
  ulint i;
  ulong local_10;
  
  in_RDI[0x28] = 0;
  for (local_10 = 0; local_10 < *in_RDI; local_10 = local_10 + 1) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x24),
                        local_10);
    auVar5 = in_ZMM2._0_16_;
    auVar4 = in_ZMM1._0_16_;
    if (*pvVar1 != 0) {
      this_00 = std::
                vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
                ::operator[]((vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
                              *)(in_RDI + 0x1e),local_10);
      dVar2 = DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::entropy(this_00);
      pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x24),
                          local_10);
      auVar4 = vcvtusi2sd_avx512f(auVar4,*pvVar1);
      auVar5 = vcvtusi2sd_avx512f(auVar5,in_RDI[3]);
      in_ZMM2 = ZEXT1664(auVar5);
      dVar3 = auVar4._0_8_ / auVar5._0_8_;
      in_ZMM1 = ZEXT1664(CONCAT88(auVar4._8_8_,dVar3));
      in_RDI[0x28] = (ulong)(dVar2 * dVar3 + (double)in_RDI[0x28]);
    }
  }
  return;
}

Assistant:

void computeActualEntropy(){//actual entropy of order k obtained with the Huffman compressor. Always >= empiricalEntropy()

		//warning:to be called AFTER initialization of structures

		bits_per_symbol = 0;//k-order empirical entropy

		for(ulint i=0;i<number_of_contexts;i++){//for each non-empty context

			if(lengths[i]>0){

				double H0 = dynStrings[i].entropy();

				bits_per_symbol += H0*((double)lengths[i]/(double)n);

			}
		}

	}